

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

adt_error_t adt_str_append_cstr(adt_str_t *self,char *cstr)

{
  adt_str_encoding_t aVar1;
  adt_str_encoding_t aVar2;
  int s32NewLen;
  int32_t newSize;
  adt_error_t result;
  adt_str_encoding_t encoding;
  int32_t s32Size;
  adt_error_t retval;
  char *cstr_local;
  adt_str_t *self_local;
  
  encoding = '\0';
  if ((self == (adt_str_t *)0x0) || (cstr == (char *)0x0)) {
    encoding = '\x01';
    aVar2 = encoding;
  }
  else {
    newSize = 0;
    _s32Size = cstr;
    cstr_local = (char *)self;
    aVar1 = adt_utf8_checkEncodingAndSize((uint8_t *)cstr,0,&newSize);
    aVar2 = encoding;
    if ((aVar1 != '\0') && (0 < newSize)) {
      s32NewLen = *(int *)cstr_local + newSize;
      aVar2 = adt_str_reserve((adt_str_t *)cstr_local,s32NewLen);
      if (aVar2 == '\0') {
        if (*(int *)(cstr_local + 4) <= s32NewLen) {
          __assert_fail("self->s32Size > newSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                        ,0x1ca,"adt_error_t adt_str_append_cstr(adt_str_t *, const char *)");
        }
        memcpy((void *)(*(long *)(cstr_local + 8) + (long)*(int *)cstr_local),_s32Size,(long)newSize
              );
        *(int *)cstr_local = s32NewLen;
        aVar2 = encoding;
        if ((cstr_local[0x11] == '\x01') && (aVar1 == '\x02')) {
          cstr_local[0x11] = '\x02';
        }
      }
    }
  }
  encoding = aVar2;
  return encoding;
}

Assistant:

adt_error_t adt_str_append_cstr(adt_str_t *self, const char *cstr)
{
   adt_error_t retval = ADT_NO_ERROR;
   if ( (self == 0) || (cstr == 0) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      int32_t s32Size = 0;
      adt_str_encoding_t encoding = adt_utf8_checkEncodingAndSize((const uint8_t*) cstr, 0, &s32Size);
      if ( (encoding != ADT_STR_ENCODING_UNKNOWN) && (s32Size > 0) )
      {
         adt_error_t result;
         int32_t newSize = self->s32Cur+s32Size;
         result = adt_str_reserve(self, newSize);
         if (result == ADT_NO_ERROR)
         {
            assert(self->s32Size > newSize);
            memcpy(self->pAlloc+self->s32Cur, cstr, s32Size);
            self->s32Cur = newSize;
            if ( (self->encoding == ADT_STR_ENCODING_ASCII) && (encoding == ADT_STR_ENCODING_UTF8) )
            {
               self->encoding = encoding;
            }
         }
         else
         {
            retval = result;
         }
      }
   }
   return retval;
}